

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# package.cpp
# Opt level: O1

void makeFullFilename(char *path,char *name,char *filename,int32_t capacity)

{
  FILE *__stream;
  undefined8 uVar1;
  int iVar2;
  uint32_t uVar3;
  size_t sVar4;
  UDataInfo *pUVar5;
  long lVar6;
  int *piVar7;
  int *suffix;
  UDataSwapper *ds;
  Item *pIVar8;
  undefined8 extraout_RAX;
  undefined4 in_register_0000000c;
  CheckDependency *check;
  int *piVar9;
  int32_t iVar10;
  void *context;
  int *piVar11;
  uint uVar12;
  int *__s;
  ulong uVar13;
  Package *this;
  Package *this_00;
  uint uVar14;
  Package *unaff_R12;
  uint32_t *puVar15;
  byte *pbVar16;
  char *pcVar17;
  UErrorCode *pErrorCode;
  UErrorCode *in_stack_fffffffffffffe20;
  undefined1 auStack_1d8 [20];
  int32_t iStack_1c4;
  NativeItem NStack_1c0;
  ResourceData RStack_190;
  NativeItem NStack_148;
  char acStack_120 [200];
  char *pcStack_58;
  Package *pPStack_50;
  
  check = (CheckDependency *)CONCAT44(in_register_0000000c,capacity);
  pcVar17 = filename;
  if ((path == (char *)0x0) || (unaff_R12 = (Package *)path, *path == '\0')) {
LAB_001efdc3:
    sVar4 = strlen(name);
    if ((int)sVar4 + ((int)pcVar17 - (int)filename) < 0x400) {
      strcpy(pcVar17,name);
      return;
    }
    pIVar8 = (Item *)name;
    makeFullFilename();
  }
  else {
    pIVar8 = (Item *)name;
    sVar4 = strlen(path);
    if ((int)sVar4 + 1 < 0x400) {
      strcpy(filename,path);
      sVar4 = strlen(filename);
      pcVar17 = filename + sVar4;
      if (filename[sVar4 - 1] != '/') {
        *pcVar17 = '/';
        pcVar17 = pcVar17 + 1;
      }
      goto LAB_001efdc3;
    }
  }
  this_00 = unaff_R12;
  makeFullFilename();
  auStack_1d8._0_4_ = U_ZERO_ERROR;
  pcStack_58 = name;
  pPStack_50 = unaff_R12;
  pUVar5 = getDataInfo(pIVar8->data,pIVar8->length,&iStack_1c4,(int32_t *)(auStack_1d8 + 4),
                       (UErrorCode *)auStack_1d8);
  if (U_ZERO_ERROR < (int)auStack_1d8._0_4_) {
    return;
  }
  piVar9 = &icu_63::dataFormats;
  lVar6 = 0;
  do {
    if (*piVar9 == *(int *)pUVar5->dataFormat) goto LAB_001efe72;
    lVar6 = lVar6 + 1;
    piVar9 = piVar9 + 1;
  } while (lVar6 != 3);
  lVar6 = 0xffffffff;
LAB_001efe72:
  iVar2 = (int)lVar6;
  if (iVar2 < 0) {
    return;
  }
  if (iVar2 != 1) {
    if (iVar2 != 0) goto LAB_001f01c7;
    NStack_148.swapped = (uint8_t *)0x0;
    icu_63::NativeItem::setItem(&NStack_148,pIVar8,ures_swap_63);
    piVar9 = (int *)pIVar8->name;
    pErrorCode = (UErrorCode *)0x1efed2;
    res_read_63(&RStack_190,NStack_148.pInfo,NStack_148.bytes,NStack_148.length,
                (UErrorCode *)auStack_1d8);
    this = (Package *)NStack_148.pInfo;
    if (U_ZERO_ERROR < (int)auStack_1d8._0_4_) goto LAB_001f0385;
    if (((1 < (byte)*(char *)((long)&(NStack_148.pInfo)->size + 0xc)) ||
        ((*(char *)((long)&(NStack_148.pInfo)->size + 0xc) == 1 &&
         (*(char *)((long)&(NStack_148.pInfo)->size + 0xd) != '\0')))) &&
       (RStack_190.noFallback == '\0')) {
      pcVar17 = strrchr((char *)piVar9,0x2f);
      __s = (int *)(pcVar17 + 1);
      if (pcVar17 == (char *)0x0) {
        __s = piVar9;
      }
      pErrorCode = (UErrorCode *)0x1eff26;
      piVar7 = (int *)strrchr((char *)__s,0x2e);
      suffix = piVar7;
      if (piVar7 == (int *)0x0) {
        pErrorCode = (UErrorCode *)0x1eff33;
        sVar4 = strlen((char *)__s);
        piVar7 = (int *)(sVar4 + (long)__s);
        suffix = piVar7;
      }
      do {
        piVar11 = piVar7;
        if (piVar7 <= __s) break;
        piVar11 = (int *)((long)piVar7 + -1);
        pcVar17 = (char *)((long)piVar7 + -1);
        piVar7 = piVar11;
      } while (*pcVar17 != '_');
      if (piVar11 == __s) {
        iVar10 = 4;
        pcVar17 = "root";
        if (((long)suffix - (long)__s == 4) && (*__s == 0x746f6f72)) goto LAB_001f0088;
      }
      else {
        iVar10 = (int)piVar11 - (int)__s;
        pcVar17 = (char *)__s;
      }
      pErrorCode = (UErrorCode *)0x1f0072;
      icu_63::makeTargetName
                ((char *)piVar9,pcVar17,iVar10,(char *)suffix,acStack_120,(int32_t)auStack_1d8,
                 in_stack_fffffffffffffe20);
      if ((int)auStack_1d8._0_4_ < U_ILLEGAL_ARGUMENT_ERROR) {
        pErrorCode = (UErrorCode *)0x1f0088;
        (*check)(context,(char *)piVar9,acStack_120);
      }
    }
LAB_001f0088:
    NStack_1c0.bytes = (uint8_t *)0x0;
    NStack_1c0.swapped = (uint8_t *)0x0;
    NStack_1c0.pItem = (Item *)0x0;
    NStack_1c0.pInfo = (UDataInfo *)0x0;
    NStack_1c0.length = 0;
    if (RStack_190.usesPoolBundle == '\0') {
LAB_001f0181:
      icu_63::ures_enumDependencies
                ((char *)piVar9,&RStack_190,RStack_190.rootRes,(char *)0x0,(char *)0x0,0,check,
                 context,(Package *)auStack_1d8,pErrorCode);
    }
    else {
      icu_63::makeTargetName
                ((char *)piVar9,"pool",4,".res",acStack_120,(int32_t)auStack_1d8,
                 in_stack_fffffffffffffe20);
      if ((int)auStack_1d8._0_4_ < U_ILLEGAL_ARGUMENT_ERROR) {
        (*check)(context,(char *)piVar9,acStack_120);
        iVar10 = icu_63::Package::findItem(this_00,acStack_120,-1);
        if (-1 < iVar10) {
          pIVar8 = icu_63::Package::getItem(this_00,iVar10);
          pErrorCode = (UErrorCode *)0x1f012b;
          icu_63::NativeItem::setItem(&NStack_1c0,pIVar8,ures_swap_63);
          if ((((NStack_1c0.pInfo)->formatVersion[0] < 2) || (NStack_1c0.bytes[4] < 8)) ||
             ((NStack_1c0.bytes[0x18] & 2) == 0)) {
            fprintf(_stderr,"icupkg: %s is not a pool bundle\n",acStack_120);
          }
          else {
            if (RStack_190.pRoot[8] == *(int *)(NStack_1c0.bytes + 0x20)) {
              RStack_190.poolBundleKeys =
                   (char *)(NStack_1c0.bytes + (ulong)NStack_1c0.bytes[4] * 4 + 4);
              RStack_190.poolBundleStrings =
                   (uint16_t *)(NStack_1c0.bytes + (long)*(int *)(NStack_1c0.bytes + 8) * 4);
              goto LAB_001f0181;
            }
            fprintf(_stderr,"icupkg: %s has mismatched checksum for %s\n",acStack_120,piVar9);
          }
        }
      }
    }
    if (NStack_1c0.swapped != (uint8_t *)0x0) {
      operator_delete__(NStack_1c0.swapped);
    }
    if (NStack_148.swapped != (uint8_t *)0x0) {
      operator_delete__(NStack_148.swapped);
    }
    goto LAB_001f01c7;
  }
  this = (Package *)auStack_1d8;
  ds = udata_openSwapper_63(pUVar5->isBigEndian,pUVar5->charsetFamily,'\0','\0',(UErrorCode *)this);
  if (U_ZERO_ERROR < (int)auStack_1d8._0_4_) {
    icu_63::Package::enumDependencies();
LAB_001f0385:
    icu_63::Package::enumDependencies(this);
    if (NStack_1c0.swapped != (uint8_t *)0x0) {
      operator_delete__(NStack_1c0.swapped);
    }
    if (NStack_148.swapped != (uint8_t *)0x0) {
      operator_delete__(NStack_148.swapped);
    }
    _Unwind_Resume(extraout_RAX);
  }
  ds->printError = printError;
  __stream = _stderr;
  ds->printErrorContext = _stderr;
  if ((pUVar5->formatVersion[0] != 6) || (pUVar5->formatVersion[1] < 2)) {
    fprintf(__stream,"icupkg/ucnv_enumDependencies(): .cnv format version %02x.%02x not supported\n"
            ,(ulong)pUVar5->formatVersion[0],(ulong)pUVar5->formatVersion[1]);
    exit(0x10);
  }
  uVar12 = pIVar8->length - auStack_1d8._4_4_;
  if ((int)uVar12 < 100) {
LAB_001effdf:
    pcVar17 = 
    "icupkg/ucnv_enumDependencies(): too few bytes (%d after header) for an ICU .cnv conversion table\n"
    ;
    uVar14 = uVar12;
LAB_001effeb:
    udata_printError_63(ds,pcVar17,(ulong)uVar14);
    auStack_1d8._0_4_ = U_INDEX_OUTOFBOUNDS_ERROR;
  }
  else {
    puVar15 = (uint32_t *)(pIVar8->data + (int)auStack_1d8._4_4_);
    auStack_1d8._8_8_ = pIVar8->name;
    uVar3 = (*ds->readUInt32)(*puVar15);
    uVar14 = uVar12 - uVar3;
    if (uVar12 < uVar3) goto LAB_001effdf;
    if (*(char *)((long)puVar15 + 0x45) != '\x02') goto LAB_001efffa;
    if ((int)uVar14 < 0x28) {
      pcVar17 = 
      "icupkg/ucnv_enumDependencies(): too few bytes (%d after headers) for an ICU MBCS .cnv conversion table\n"
      ;
      goto LAB_001effeb;
    }
    pbVar16 = (byte *)((long)puVar15 + (ulong)uVar3);
    if (*pbVar16 == 5) {
      if ((2 < pbVar16[1]) &&
         (uVar3 = (*ds->readUInt32)(*(uint32_t *)(pbVar16 + 0x20)), (uVar3 & 0xff80) == 0)) {
        uVar13 = (ulong)((uVar3 & 0x3f) << 2);
        goto LAB_001f029e;
      }
LAB_001f0223:
      udata_printError_63(ds,
                          "icupkg/ucnv_enumDependencies(): unsupported _MBCSHeader.version %d.%d\n",
                          (ulong)*pbVar16,(ulong)pbVar16[1]);
LAB_001f023e:
      auStack_1d8._0_4_ = U_UNSUPPORTED_ERROR;
    }
    else {
      if ((*pbVar16 != 4) || (uVar13 = 0x20, pbVar16[1] == 0)) goto LAB_001f0223;
LAB_001f029e:
      uVar3 = (*ds->readUInt32)(*(uint32_t *)(pbVar16 + 0x18));
      if ((char)uVar3 == '\x0e') {
        if ((int)uVar14 < (int)((uVar3 >> 8) + 0x80)) {
          pcVar17 = 
          "icupkg/ucnv_enumDependencies(): too few bytes (%d after headers) for an ICU MBCS .cnv conversion table with extension data\n"
          ;
          goto LAB_001effeb;
        }
        sVar4 = strlen((char *)(pbVar16 + uVar13));
        if ((int)sVar4 < 0x20) {
          (*ds->swapInvChars)(ds,pbVar16 + uVar13,(int)sVar4 + 1,&RStack_190,
                              (UErrorCode *)auStack_1d8);
          uVar1 = auStack_1d8._8_8_;
          icu_63::makeTargetName
                    ((char *)auStack_1d8._8_8_,(char *)&RStack_190,-1,".cnv",acStack_120,
                     (int32_t)auStack_1d8,in_stack_fffffffffffffe20);
          if ((int)auStack_1d8._0_4_ < U_ILLEGAL_ARGUMENT_ERROR) {
            (*check)(context,(char *)uVar1,acStack_120);
          }
          goto LAB_001efffa;
        }
        udata_printError_63(ds,"icupkg/ucnv_enumDependencies(%s): base name length %ld too long\n",
                            auStack_1d8._8_8_,sVar4 & 0xffffffff);
        goto LAB_001f023e;
      }
    }
  }
LAB_001efffa:
  udata_closeSwapper_63(ds);
LAB_001f01c7:
  if ((int)auStack_1d8._0_4_ < U_ILLEGAL_ARGUMENT_ERROR) {
    return;
  }
  exit(auStack_1d8._0_4_);
}

Assistant:

static void
makeFullFilename(const char *path, const char *name,
                 char *filename, int32_t capacity) {
    char *s;

    // prepend the path unless NULL or empty
    if(path!=NULL && path[0]!=0) {
        if((int32_t)(strlen(path)+1)>=capacity) {
            fprintf(stderr, "pathname too long: \"%s\"\n", path);
            exit(U_BUFFER_OVERFLOW_ERROR);
        }
        strcpy(filename, path);

        // make sure the path ends with a file separator
        s=strchr(filename, 0);
        if(*(s-1)!=U_FILE_SEP_CHAR && *(s-1)!=U_FILE_ALT_SEP_CHAR) {
            *s++=U_FILE_SEP_CHAR;
        }
    } else {
        s=filename;
    }

    // turn the name into a filename, turn tree separators into file separators
    if((int32_t)((s-filename)+strlen(name))>=capacity) {
        fprintf(stderr, "path/filename too long: \"%s%s\"\n", filename, name);
        exit(U_BUFFER_OVERFLOW_ERROR);
    }
    strcpy(s, name);
    treeToPath(s);
}